

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O2

string * __thiscall
duckdb::StringUtil::Format<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          LogicalType *params_1,LogicalType *params_2)

{
  LogicalType local_70;
  undefined1 local_58 [24];
  string local_40;
  
  ::std::__cxx11::string::string((string *)(local_58 + 0x18),(string *)fmt_str);
  LogicalType::LogicalType((LogicalType *)local_58,(LogicalType *)params);
  LogicalType::LogicalType(&local_70,params_1);
  Exception::ConstructMessage<std::__cxx11::string,duckdb::LogicalType,duckdb::LogicalType>
            (__return_storage_ptr__,(Exception *)this,(string *)(local_58 + 0x18),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,&local_70
             ,params_2);
  LogicalType::~LogicalType(&local_70);
  LogicalType::~LogicalType((LogicalType *)local_58);
  ::std::__cxx11::string::~string((string *)(local_58 + 0x18));
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}